

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

void Enum(void)

{
  pointer pdVar1;
  iterator __begin1;
  pointer pvVar2;
  ostream *poVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  size_t i_3;
  pointer pvVar5;
  size_t j_1;
  size_t j;
  long lVar6;
  size_t j_2;
  long lVar7;
  double *i;
  pointer pdVar8;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator_type local_d1;
  vector<double,_std::allocator<double>_> expertopinion;
  vector<double,_std::allocator<double>_> result;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  temp;
  vector<double,_std::allocator<double>_> length;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_70;
  double local_58 [6];
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&temp,&marks);
  length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&length,4);
  for (pvVar5 = temp.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = temp.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pvVar5 != temp.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar5 = pvVar5 + 1) {
    pdVar1 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar6 = 0; (long)pdVar8 - (long)pdVar1 >> 3 != lVar6; lVar6 = lVar6 + 1) {
      length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           pdVar1[lVar6] +
           length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6];
    }
  }
  for (; pvVar2 != temp.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    pdVar1 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar6 = 0; (long)pdVar8 - (long)pdVar1 >> 3 != lVar6; lVar6 = lVar6 + 1) {
      pdVar1[lVar6] =
           pdVar1[lVar6] /
           length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6];
    }
  }
  std::operator<<((ostream *)&std::cout,"\nNormalized Matrix\n");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_70,&temp);
  printMatrix(&local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_70);
  local_58[4] = 1.0;
  local_58[5] = 1.0;
  local_58[2] = 1.0;
  local_58[3] = 1.0;
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  __l._M_len = 6;
  __l._M_array = local_58;
  std::vector<double,_std::allocator<double>_>::vector(&expertopinion,__l,(allocator_type *)&result)
  ;
  std::operator<<((ostream *)&std::cout,"\nExpert Asseessment of criteria:");
  pdVar1 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar8 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar3 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar3," ");
    if ((*pdVar8 !=
         expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar8) ||
        NAN(expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[0] = 3.0;
  local_58[1] = 2.0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&expertopinion,local_58);
  std::operator<<((ostream *)&std::cout,"Criteria weights vector: ");
  pdVar1 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar8 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar3 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar3," ");
    if ((*pdVar8 !=
         expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar8) ||
        NAN(expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  normalize(&expertopinion);
  std::operator<<((ostream *)&std::cout,"\nNormalized Vector of Weights:    \t");
  pdVar1 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar8 = expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 3;
    poVar3 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar3," ");
    if ((*pdVar8 !=
         expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) ||
       (NAN(*pdVar8) ||
        NAN(expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  __l_00._M_len = 4;
  __l_00._M_array = local_58;
  std::vector<double,_std::allocator<double>_>::vector(&result,__l_00,&local_d1);
  for (lVar6 = 0;
      lVar6 != ((long)temp.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)temp.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar6 = lVar6 + 1) {
    pdVar1 = temp.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar8 = temp.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (lVar7 = 0; (long)pdVar8 - (long)pdVar1 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           pdVar1[lVar7] *
           expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7] +
           result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6];
    }
  }
  std::operator<<((ostream *)&std::cout,"\n\nMatrix of values of the combined criterion:");
  pdVar1 = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar8 = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar3," ");
    if ((*pdVar8 !=
         result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish[-1]) ||
       (NAN(*pdVar8) ||
        NAN(result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]))) {
      std::operator<<((ostream *)&std::cout," ; ");
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  _Var4 = std::
          __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  std::operator<<((ostream *)&std::cout,"\nHighest Value = ");
  std::ostream::_M_insert<double>(*_Var4._M_current);
  std::operator<<((ostream *)&std::cout,"\nBest choice is: ");
  cars((int)((ulong)((long)_Var4._M_current -
                    (long)result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&temp);
  if (length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    length.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = length.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         expertopinion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&result.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&expertopinion.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&length.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&temp);
  return;
}

Assistant:

void Enum(){
    vector<vector<double>> temp(marks);
    vector<double> length;
    vector<double>::iterator res;
    length.resize(4);
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            length[j]+=i[j];
    }
    for(auto &i:temp){
        for(size_t j=0;j<i.size();j++)
            i[j] /= length[j];
    }

    cout << "\nNormalized Matrix\n";
    printMatrix(temp);


    vector<double> expertopinion={1,1,1,1,1,1};
    cout << "\nExpert Asseessment of criteria:";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i!=expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    expertopinion={3,2,1,0};
    cout << "Criteria weights vector: ";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    normalize(expertopinion);
    cout << "\nNormalized Vector of Weights:    \t";
    for(const auto &i:expertopinion){
        cout << setw(3) << i << " ";
        if(i != expertopinion[expertopinion.size()-1])
            cout << " ; ";
    }
    cout << endl;

    vector<double> result={0,0,0,0};
    for(size_t i=0;i<temp.size();i++){
        for(size_t j=0;j<temp[i].size();j++)
            result[i]+=temp[i][j]*expertopinion[j];
    }

    cout << "\n\nMatrix of values of the combined criterion:";
    for(const auto &i:result){
        cout << i << " ";
        if(i!=result[result.size()-1])
            cout << " ; ";
    }
    cout << endl;

    res=max_element(result.begin(),result.end());
    cout << "\nHighest Value = " << result[distance(result.begin(),res)];
    cout << "\nBest choice is: ";
    cars(std::distance(result.begin(),res));

    temp.clear();
    length.clear();
    expertopinion.clear();
    result.clear();
}